

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_util.cpp
# Opt level: O0

i32_t Kumu::base64decode(char *str,byte_t *buf,ui32_t buf_len,ui32_t *char_count)

{
  byte bVar1;
  int iVar2;
  byte_t *pbVar3;
  uint local_3c;
  int local_38;
  ui32_t i;
  ui32_t phase;
  byte_t d;
  byte_t c;
  ui32_t *char_count_local;
  ui32_t buf_len_local;
  byte_t *buf_local;
  char *str_local;
  
  i._2_1_ = 0;
  local_38 = 0;
  local_3c = 0;
  if (((str == (char *)0x0) || (buf == (byte_t *)0x0)) ||
     (iVar2 = local_38, buf_local = (byte_t *)str, char_count == (ui32_t *)0x0)) {
    str_local._4_4_ = -1;
  }
  else {
    while (local_38 = iVar2, *buf_local != '\0' && local_3c < buf_len) {
      pbVar3 = buf_local + 1;
      bVar1 = decode_map[(int)(char)*buf_local];
      iVar2 = local_38;
      buf_local = pbVar3;
      if (bVar1 != 0xff) {
        if (bVar1 == 0xfe) break;
        iVar2 = local_38 + 1;
        switch(local_38) {
        case 0:
          buf[local_3c] = bVar1 << 2;
          local_3c = local_3c + 1;
          break;
        case 1:
          buf[local_3c - 1] = buf[local_3c - 1] | (byte)((int)(uint)bVar1 >> 4);
          i._2_1_ = bVar1;
          break;
        case 2:
          buf[local_3c] = i._2_1_ << 4 | (byte)((int)(uint)bVar1 >> 2);
          local_3c = local_3c + 1;
          i._2_1_ = bVar1;
          break;
        case 3:
          buf[local_3c] = i._2_1_ << 6 | bVar1;
          local_38 = 0;
          local_3c = local_3c + 1;
          iVar2 = local_38;
        }
      }
    }
    *char_count = local_3c;
    str_local._4_4_ = 0;
  }
  return str_local._4_4_;
}

Assistant:

i32_t
Kumu::base64decode(const char* str, byte_t* buf, ui32_t buf_len, ui32_t* char_count)
{
  byte_t c = 0, d = 0;
  ui32_t phase = 0, i = 0;

  if ( str == 0 || buf == 0 || char_count == 0 )
    return -1;

  while ( *str != 0 && i < buf_len )
    {
      c = decode_map[(int)*str++];
      if ( c == 0xff ) continue;
      if ( c == 0xfe ) break;

      switch ( phase++ )
	{
	case 0:
	  buf[i++] =  c << 2;
	  break;

	case 1:
	  buf[i - 1] |= c >> 4;
	  d = c;
	  break;

	case 2:
	  buf[i++] =  ( d << 4 ) | ( c >> 2 );
	  d = c;
	  break;

	case 3:
	  buf[i++] =  ( d << 6 ) | c;
	  phase = 0;
	  break;
	}
    }

  *char_count = i;
  return 0;
}